

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetCursorPosYAndSetupForPrevLine(float pos_y,float line_height)

{
  ImGuiWindow *pIVar1;
  ImGuiColumns *pIVar2;
  ImGuiContext *pIVar3;
  float fVar4;
  ImGuiColumns *columns;
  ImGuiWindow *window;
  ImGuiContext *g;
  float line_height_local;
  float pos_y_local;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  (pIVar1->DC).CursorPos.y = pos_y;
  fVar4 = ImMax<float>((pIVar1->DC).CursorMaxPos.y,pos_y);
  (pIVar1->DC).CursorMaxPos.y = fVar4;
  (pIVar1->DC).CursorPosPrevLine.y = (pIVar1->DC).CursorPos.y - line_height;
  (pIVar1->DC).PrevLineSize.y = line_height - (pIVar3->Style).ItemSpacing.y;
  pIVar2 = (pIVar1->DC).CurrentColumns;
  if (pIVar2 != (ImGuiColumns *)0x0) {
    pIVar2->LineMinY = (pIVar1->DC).CursorPos.y;
  }
  return;
}

Assistant:

static void SetCursorPosYAndSetupForPrevLine(float pos_y, float line_height)
{
    // Set cursor position and a few other things so that SetScrollHereY() and Columns() can work when seeking cursor.
    // FIXME: It is problematic that we have to do that here, because custom/equivalent end-user code would stumble on the same issue.
    // The clipper should probably have a 4th step to display the last item in a regular manner.
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.CursorPos.y = pos_y;
    window->DC.CursorMaxPos.y = ImMax(window->DC.CursorMaxPos.y, pos_y);
    window->DC.CursorPosPrevLine.y = window->DC.CursorPos.y - line_height;  // Setting those fields so that SetScrollHereY() can properly function after the end of our clipper usage.
    window->DC.PrevLineSize.y = (line_height - g.Style.ItemSpacing.y);      // If we end up needing more accurate data (to e.g. use SameLine) we may as well make the clipper have a fourth step to let user process and display the last item in their list.
    if (ImGuiColumns* columns = window->DC.CurrentColumns)
        columns->LineMinY = window->DC.CursorPos.y;                         // Setting this so that cell Y position are set properly
}